

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O2

void __thiscall dmlc::LogCheckError::~LogCheckError(LogCheckError *this)

{
  string *this_00;
  
  this_00 = this->str;
  if (this_00 != (string *)0x0) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00,0x20);
    return;
  }
  return;
}

Assistant:

~LogCheckError() {
    if (str != nullptr)
      delete str;
  }